

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
::resize(raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
         *this,size_t new_capacity)

{
  size_t hashval;
  ctrl_t *p;
  size_t capacity;
  proxy *ppVar1;
  slot_type *psVar2;
  undefined1 auVar3 [16];
  int iVar4;
  undefined4 extraout_var;
  size_t i;
  slot_type *this_00;
  size_t sVar6;
  FindInfo FVar7;
  Layout LVar8;
  ulong uVar5;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    p = this->ctrl_;
    this_00 = this->slots_;
    capacity = this->capacity_;
    initialize_slots(this,new_capacity);
    this->capacity_ = new_capacity;
    if (capacity != 0) {
      sVar6 = 0;
      do {
        if (-1 < p[sVar6]) {
          ppVar1 = (this_00->value).first.mDat;
          if (ppVar1 == (proxy *)0x0) {
            uVar5 = 0;
          }
          else {
            iVar4 = (*ppVar1->data->_vptr_baseHolder[7])();
            uVar5 = CONCAT44(extraout_var,iVar4);
          }
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar5;
          hashval = SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),8) +
                    SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),0);
          FVar7 = find_first_non_full(this,hashval);
          i = FVar7.offset;
          set_ctrl(this,i,(byte)hashval & 0x7f);
          psVar2 = this->slots_;
          psVar2[i].value.first.mDat = (proxy *)0x0;
          psVar2[i].value.first.mDat = (this_00->value).first.mDat;
          (this_00->value).first.mDat = (proxy *)0x0;
          *(statement_block **)((long)psVar2 + i * 0x10 + 8) = (this_00->value).second;
          cs_impl::any::recycle(&this_00->key);
        }
        sVar6 = sVar6 + 1;
        this_00 = this_00 + 1;
      } while (capacity != sVar6);
      LVar8 = MakeLayout(capacity);
      Deallocate<8ul,std::allocator<std::pair<cs_impl::any_const,cs::statement_block*>>>
                ((allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_> *)
                 &this->settings_,p,
                 LVar8.
                 super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<cs_impl::any,_cs::statement_block_*>_>
                 .size_[1] * 0x10 +
                 (LVar8.
                  super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<cs_impl::any,_cs::statement_block_*>_>
                  .size_[0] + 7 & 0xfffffffffffffff8));
      return;
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x8dd,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any, cs::statement_block *>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<std::pair<const cs_impl::any, cs::statement_block *>>>::resize(size_t) [Policy = phmap::priv::FlatHashMapPolicy<cs_impl::any, cs::statement_block *>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<std::pair<const cs_impl::any, cs::statement_block *>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n)
		{
			return ((n + 1) & n) == 0 && n > 0;
		}